

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.cpp
# Opt level: O0

void __thiscall
ObjectFactorySystem::GetAll
          (ObjectFactorySystem *this,IAUDynArray<IObjectConstructor_*> *constructors)

{
  IObjectConstructor *pIVar1;
  bool bVar2;
  size_type sVar3;
  reference ppIVar4;
  IObjectConstructor **ppIVar5;
  int local_2c;
  const_iterator cStack_28;
  int i;
  const_iterator itEnd;
  const_iterator it;
  IAUDynArray<IObjectConstructor_*> *constructors_local;
  ObjectFactorySystem *this_local;
  
  sVar3 = std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::size
                    (&this->m_Constructors);
  (*(code *)**(undefined8 **)constructors)(constructors,sVar3);
  itEnd = std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::begin
                    (&this->m_Constructors);
  cStack_28 = std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::end
                        (&this->m_Constructors);
  local_2c = 0;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&itEnd,&stack0xffffffffffffffd8);
    if (!bVar2) break;
    ppIVar4 = __gnu_cxx::
              __normal_iterator<IObjectConstructor_*const_*,_std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>_>
              ::operator*(&itEnd);
    pIVar1 = *ppIVar4;
    ppIVar5 = IAUDynArray<IObjectConstructor_*>::operator[](constructors,(long)local_2c);
    *ppIVar5 = pIVar1;
    __gnu_cxx::
    __normal_iterator<IObjectConstructor_*const_*,_std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>_>
    ::operator++(&itEnd);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void ObjectFactorySystem::GetAll(IAUDynArray<IObjectConstructor*> &constructors) const
{
	constructors.Resize(m_Constructors.size());
	std::vector<IObjectConstructor*>::const_iterator it = m_Constructors.begin();
	std::vector<IObjectConstructor*>::const_iterator itEnd = m_Constructors.end();
	for(int i = 0; it != itEnd; ++it, ++i)
	{
		constructors[i] = *it;
	}
}